

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushItemFlag(ImGuiItemFlags option,bool enabled)

{
  int *piVar1;
  ImVector<int> *pIVar2;
  ImGuiWindow *pIVar3;
  int *piVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *ctx;
  int *piVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined7 in_register_00000031;
  uint uVar10;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  if ((int)CONCAT71(in_register_00000031,enabled) == 0) {
    uVar10 = ~option & (pIVar3->DC).ItemFlags;
  }
  else {
    uVar10 = option | (pIVar3->DC).ItemFlags;
  }
  (pIVar3->DC).ItemFlags = uVar10;
  iVar7 = (pIVar3->DC).ItemFlagsStack.Size;
  if (iVar7 == (pIVar3->DC).ItemFlagsStack.Capacity) {
    if (iVar7 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar7 / 2 + iVar7;
    }
    iVar9 = iVar7 + 1;
    if (iVar7 + 1 < iVar8) {
      iVar9 = iVar8;
    }
    piVar6 = &(pIVar5->IO).MetricsActiveAllocations;
    *piVar6 = *piVar6 + 1;
    piVar6 = (int *)(*GImAllocatorAllocFunc)((long)iVar9 << 2,GImAllocatorUserData);
    piVar4 = (pIVar3->DC).ItemFlagsStack.Data;
    if (piVar4 != (int *)0x0) {
      memcpy(piVar6,piVar4,(long)(pIVar3->DC).ItemFlagsStack.Size << 2);
      piVar4 = (pIVar3->DC).ItemFlagsStack.Data;
      if ((piVar4 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar4,GImAllocatorUserData);
    }
    (pIVar3->DC).ItemFlagsStack.Data = piVar6;
    (pIVar3->DC).ItemFlagsStack.Capacity = iVar9;
    uVar10 = (pIVar3->DC).ItemFlags;
    iVar7 = (pIVar3->DC).ItemFlagsStack.Size;
  }
  else {
    piVar6 = (pIVar3->DC).ItemFlagsStack.Data;
  }
  piVar6[iVar7] = uVar10;
  pIVar2 = &(pIVar3->DC).ItemFlagsStack;
  pIVar2->Size = pIVar2->Size + 1;
  return;
}

Assistant:

bool ImGuiTextFilter::Draw(const char* label, float width)
{
    if (width != 0.0f)
        ImGui::SetNextItemWidth(width);
    bool value_changed = ImGui::InputText(label, InputBuf, IM_ARRAYSIZE(InputBuf));
    if (value_changed)
        Build();
    return value_changed;
}